

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall ncnn::Extractor::~Extractor(Extractor *this)

{
  ~Extractor(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

Extractor::~Extractor()
{
    clear();

    delete d;
}